

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbios_mgmt.c
# Opt level: O0

int vbios_read(char *filename,uint8_t **vbios,uint16_t *length)

{
  FILE *__stream;
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  ushort *in_RDX;
  long *in_RSI;
  char *in_RDI;
  FILE *fd_bios;
  int local_4;
  
  if ((in_RSI == (long *)0x0) || (in_RDX == (ushort *)0x0)) {
    local_4 = -4;
  }
  else {
    *in_RSI = 0;
    *in_RDX = 0;
    __stream = fopen(in_RDI,"rb");
    if (__stream == (FILE *)0x0) {
      local_4 = -3;
    }
    else {
      fseek(__stream,0,2);
      lVar1 = ftell(__stream);
      *in_RDX = (ushort)lVar1;
      fseek(__stream,0,0);
      if (*in_RDX == 0) {
        local_4 = -3;
      }
      else {
        pvVar2 = malloc((ulong)*in_RDX);
        *in_RSI = (long)pvVar2;
        sVar3 = fread((void *)*in_RSI,1,(ulong)*in_RDX,__stream);
        if (sVar3 < *in_RDX) {
          free((void *)*in_RSI);
          local_4 = -3;
        }
        else {
          fclose(__stream);
          if ((*(char *)*in_RSI == 'U') && (*(char *)(*in_RSI + 1) == -0x56)) {
            *in_RDX = (ushort)*(byte *)(*in_RSI + 2) << 9;
            local_4 = 1;
          }
          else {
            local_4 = -5;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int vbios_read(const char *filename, uint8_t **vbios, uint16_t *length)
{
	FILE * fd_bios;

	if (!vbios || !length)
		return EARG;
	*vbios = NULL;
	*length = 0;

	fd_bios = fopen(filename ,"rb");
	if (!fd_bios)
		return EIOFAIL;

	/* get the size */
	fseek(fd_bios, 0, SEEK_END);
	*length = ftell(fd_bios);
	fseek(fd_bios, 0, SEEK_SET);

	if (*length <= 0)
		return EIOFAIL;

	/* Read the vbios */
	*vbios = malloc(*length * sizeof(char));
	if (fread(*vbios, 1, *length, fd_bios) < *length) {
		free(*vbios);
		return EIOFAIL;
	}
	fclose (fd_bios);

	/* vbios verification */
	if ((*vbios)[0] != 0x55 || (*vbios)[1] != 0xaa)
		return ENOTVBIOS;

	/* Set the right length */
	*length = (*vbios)[2] * 512;

	return EOK;
}